

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O0

Hop_Obj_t *
Abc_NodeIfToHop_rec(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  If_Cut_t *pCut_00;
  void *pvVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *gFunc1;
  Hop_Obj_t *gFunc0;
  Hop_Obj_t *gFunc;
  If_Cut_t *pCut;
  Vec_Ptr_t *vVisited_local;
  If_Obj_t *pIfObj_local;
  If_Man_t *pIfMan_local;
  Hop_Man_t *pHopMan_local;
  
  pCut_00 = If_ObjCutBest(pIfObj);
  pvVar1 = If_CutData(pCut_00);
  if (pvVar1 == (void *)0x0) {
    pHVar2 = Abc_NodeIfToHop_rec(pHopMan,pIfMan,pIfObj->pFanin0,vVisited);
    pHVar3 = Abc_NodeIfToHop_rec(pHopMan,pIfMan,pIfObj->pFanin1,vVisited);
    pHVar2 = Hop_NotCond(pHVar2,*(uint *)pIfObj >> 4 & 1);
    pHVar3 = Hop_NotCond(pHVar3,*(uint *)pIfObj >> 5 & 1);
    pHopMan_local = (Hop_Man_t *)Hop_And(pHopMan,pHVar2,pHVar3);
    pvVar1 = If_CutData(pCut_00);
    if (pvVar1 != (void *)0x0) {
      __assert_fail("If_CutData(pCut) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                    ,0x23c,
                    "Hop_Obj_t *Abc_NodeIfToHop_rec(Hop_Man_t *, If_Man_t *, If_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    If_CutSetData(pCut_00,pHopMan_local);
    Vec_PtrPush(vVisited,pCut_00);
  }
  else {
    pHopMan_local = (Hop_Man_t *)If_CutData(pCut_00);
  }
  return (Hop_Obj_t *)pHopMan_local;
}

Assistant:

Hop_Obj_t * Abc_NodeIfToHop_rec( Hop_Man_t * pHopMan, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited )
{
    If_Cut_t * pCut;
    Hop_Obj_t * gFunc, * gFunc0, * gFunc1;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutData(pCut) )
        return (Hop_Obj_t *)If_CutData(pCut);
    // compute the functions of the children
    gFunc0 = Abc_NodeIfToHop_rec( pHopMan, pIfMan, pIfObj->pFanin0, vVisited );
    gFunc1 = Abc_NodeIfToHop_rec( pHopMan, pIfMan, pIfObj->pFanin1, vVisited );
    // get the function of the cut
    gFunc  = Hop_And( pHopMan, Hop_NotCond(gFunc0, pIfObj->fCompl0), Hop_NotCond(gFunc1, pIfObj->fCompl1) );  
    assert( If_CutData(pCut) == NULL );
    If_CutSetData( pCut, gFunc );
    // add this cut to the visited list
    Vec_PtrPush( vVisited, pCut );
    return gFunc;
}